

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

bool WriteToFile(string *path,Span<const_unsigned_char> in)

{
  pointer pcVar1;
  FILE *__stream;
  size_t sVar2;
  int *piVar3;
  char *pcVar4;
  bool bVar5;
  char *__format;
  ScopedFILE file;
  
  file._M_t.super___uniq_ptr_impl<_IO_FILE,_FileCloser>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_FileCloser>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_IO_FILE,_FileCloser,_true,_true>)
                 fopen((path->_M_dataplus)._M_p,"wb");
  if ((tuple<_IO_FILE_*,_FileCloser>)
      file._M_t.super___uniq_ptr_impl<_IO_FILE,_FileCloser>._M_t.
      super__Tuple_impl<0UL,__IO_FILE_*,_FileCloser>.super__Head_base<0UL,__IO_FILE_*,_false>.
      _M_head_impl == (_Head_base<0UL,__IO_FILE_*,_false>)0x0) {
    __format = "Failed to open \'%s\': %s\n";
  }
  else {
    sVar2 = fwrite(in.data_,in.size_,1,
                   (FILE *)file._M_t.super___uniq_ptr_impl<_IO_FILE,_FileCloser>._M_t.
                           super__Tuple_impl<0UL,__IO_FILE_*,_FileCloser>.
                           super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
    bVar5 = true;
    if (sVar2 == 1) goto LAB_00123ad0;
    __format = "Failed to write to \'%s\': %s\n";
  }
  __stream = _stderr;
  pcVar1 = (path->_M_dataplus)._M_p;
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  bVar5 = false;
  fprintf(__stream,__format,pcVar1,pcVar4);
LAB_00123ad0:
  std::unique_ptr<_IO_FILE,_FileCloser>::~unique_ptr(&file);
  return bVar5;
}

Assistant:

bool WriteToFile(const std::string &path, bssl::Span<const uint8_t> in) {
  ScopedFILE file(fopen(path.c_str(), "wb"));
  if (!file) {
    fprintf(stderr, "Failed to open '%s': %s\n", path.c_str(), strerror(errno));
    return false;
  }
  if (fwrite(in.data(), in.size(), 1, file.get()) != 1) {
    fprintf(stderr, "Failed to write to '%s': %s\n", path.c_str(),
            strerror(errno));
    return false;
  }
  return true;
}